

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_426d84::BracedExpr::printLeft(BracedExpr *this,OutputStream *S)

{
  Kind KVar1;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  BracedExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  if ((this->IsArray & 1U) == 0) {
    OutputStream::operator+=(S,'.');
    Node::print(this->Elem,local_18);
  }
  else {
    OutputStream::operator+=(S,'[');
    Node::print(this->Elem,local_18);
    OutputStream::operator+=(local_18,']');
  }
  KVar1 = Node::getKind(this->Init);
  if (KVar1 != KBracedExpr) {
    KVar1 = Node::getKind(this->Init);
    if (KVar1 != KBracedRangeExpr) {
      StringView::StringView(&local_28," = ");
      OutputStream::operator+=(local_18,local_28);
    }
  }
  Node::print(this->Init,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsArray) {
      S += '[';
      Elem->print(S);
      S += ']';
    } else {
      S += '.';
      Elem->print(S);
    }
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }